

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O1

void __thiscall Imf_3_4::Image::shiftPixels(Image *this,int dx,int dy)

{
  Box2i BVar1;
  long *plVar2;
  _Rb_tree_node_base *p_Var3;
  long lVar4;
  ostream *poVar5;
  ArgExc *pAVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  stringstream _iex_throw_s;
  stringstream asStack_1b8 [16];
  ostream local_1a8 [376];
  
  p_Var3 = (this->_channels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var3 == &(this->_channels)._M_t._M_impl.super__Rb_tree_header) {
      BVar1 = this->_dataWindow;
      (this->_dataWindow).min.x = dx + BVar1.min.x;
      (this->_dataWindow).min.y = dy + BVar1.min.y;
      (this->_dataWindow).max.x = dx + BVar1.max.x;
      (this->_dataWindow).max.y = dy + BVar1.max.y;
      if (0 < (this->_levels)._sizeX) {
        lVar7 = 0;
        lVar8 = 0;
        do {
          lVar4 = (this->_levels)._sizeY;
          if (0 < lVar4) {
            lVar9 = 0;
            do {
              plVar2 = *(long **)((long)(this->_levels)._data + lVar9 * 8 + lVar4 * lVar7);
              if (plVar2 != (long *)0x0) {
                (**(code **)(*plVar2 + 0x18))(plVar2,dx,dy);
              }
              lVar9 = lVar9 + 1;
              lVar4 = (this->_levels)._sizeY;
            } while (lVar9 < lVar4);
          }
          lVar8 = lVar8 + 1;
          lVar7 = lVar7 + 8;
        } while (lVar8 < (this->_levels)._sizeX);
      }
      return;
    }
    if (dx % *(int *)&p_Var3[2].field_0x4 != 0) break;
    if (dy % *(int *)&p_Var3[2]._M_parent != 0) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(asStack_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"Cannot shift image vertically by ",0x21);
      poVar5 = (ostream *)std::ostream::operator<<(local_1a8,dy);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,
                 " pixels.  The shift distance must be a multiple of the y sampling rate of all channels, but the y sampling rate channel "
                 ,0x78);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,*(char **)(p_Var3 + 1),(long)p_Var3[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," is ",4);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(int *)&p_Var3[2]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
      pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar6,asStack_1b8);
      __cxa_throw(pAVar6,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"Cannot shift image horizontally by ",0x23);
  poVar5 = (ostream *)std::ostream::operator<<(local_1a8,dx);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,
             " pixels.  The shift distance must be a multiple of the x sampling rate of all channels, but the x sampling rate channel "
             ,0x78);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,*(char **)(p_Var3 + 1),(long)p_Var3[1]._M_parent);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," is ",4);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(int *)&p_Var3[2].field_0x4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
  pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(pAVar6,asStack_1b8);
  __cxa_throw(pAVar6,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
Image::shiftPixels (int dx, int dy)
{
    for (ChannelMap::iterator i = _channels.begin (); i != _channels.end ();
         ++i)
    {
        if (dx % i->second.xSampling != 0)
        {
            THROW (
                ArgExc,
                "Cannot shift image horizontally by "
                    << dx
                    << " "
                       "pixels.  The shift distance must be a multiple "
                       "of the x sampling rate of all channels, but the "
                       "x sampling rate channel "
                    << i->first
                    << " "
                       "is "
                    << i->second.xSampling << ".");
        }

        if (dy % i->second.ySampling != 0)
        {
            THROW (
                ArgExc,
                "Cannot shift image vertically by "
                    << dy
                    << " "
                       "pixels.  The shift distance must be a multiple "
                       "of the y sampling rate of all channels, but the "
                       "y sampling rate channel "
                    << i->first
                    << " "
                       "is "
                    << i->second.ySampling << ".");
        }
    }

    _dataWindow.min.x += dx;
    _dataWindow.min.y += dy;
    _dataWindow.max.x += dx;
    _dataWindow.max.y += dy;

    for (int y = 0; y < _levels.height (); ++y)
        for (int x = 0; x < _levels.width (); ++x)
            if (_levels[y][x]) _levels[y][x]->shiftPixels (dx, dy);
}